

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cc
# Opt level: O2

void __thiscall google::protobuf::strings::LimitByteSource::Skip(LimitByteSource *this,size_t n)

{
  LogMessage *other;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (this->limit_ < n) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/bytestream.cc"
               ,0xb9);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (n) <= (limit_): ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  (*this->source_->_vptr_ByteSource[4])(this->source_,n);
  this->limit_ = this->limit_ - n;
  return;
}

Assistant:

void LimitByteSource::Skip(size_t n) {
  GOOGLE_DCHECK_LE(n, limit_);
  source_->Skip(n);
  limit_ -= n;
}